

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

char * mcpl_internal_calloc(size_t num,size_t size)

{
  char *pcVar1;
  
  pcVar1 = (char *)calloc(num + (num == 0),size + (size == 0));
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  mcpl_error("memory allocation failed");
}

Assistant:

MCPL_LOCAL char * mcpl_internal_calloc(size_t num, size_t size)
{
  char * res = (char*)calloc( ( num ? num : 1 ),
                              ( size ? size : 1 ) );
  if (!res)
    mcpl_error("memory allocation failed");
  return res;
}